

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O0

void Diligent::ValidatePipelineResourceSignatureDesc
               (PipelineResourceSignatureDesc *Desc,IRenderDevice *pDevice,
               RENDER_DEVICE_TYPE DeviceType)

{
  PIPELINE_RESOURCE_FLAGS a;
  _func_int *p_Var1;
  undefined *puVar2;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
  Args;
  undefined8 Args_8;
  _func_int **Args_4;
  bool bVar3;
  PIPELINE_RESOURCE_FLAGS PVar4;
  int iVar5;
  SHADER_TYPE SVar6;
  undefined4 extraout_var;
  pointer ppVar7;
  Char *pCVar8;
  pointer ppVar9;
  pointer ppVar10;
  undefined8 uVar11;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
  _Var12;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
  _Var13;
  Char **Args_4_00;
  char (*Args_00) [20];
  SHADER_TYPE extraout_EDX;
  SHADER_TYPE extraout_EDX_00;
  SHADER_TYPE ShaderStages;
  SHADER_TYPE extraout_EDX_01;
  SHADER_TYPE extraout_EDX_02;
  SHADER_TYPE extraout_EDX_03;
  SHADER_TYPE extraout_EDX_04;
  SHADER_TYPE extraout_EDX_05;
  SHADER_TYPE ShaderStages_00;
  SHADER_TYPE ShaderStages_01;
  SHADER_TYPE ShaderStages_02;
  SHADER_TYPE ShaderStages_03;
  SHADER_TYPE ShaderStages_04;
  SHADER_TYPE ShaderStages_05;
  SHADER_TYPE ShaderStages_06;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>_>
  *__y;
  char *in_R8;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>_>
  pVar14;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>_>
  pVar15;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>_>
  pVar16;
  char *in_stack_fffffffffffff668;
  _func_int **local_8f0;
  _func_int **local_8a8;
  _func_int **local_888;
  _func_int **local_878;
  _func_int **local_830;
  _func_int **local_828;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
  local_808;
  _func_int **local_800;
  _func_int **local_7f8;
  _func_int **local_7e8;
  _func_int **local_7d8;
  _func_int **local_7c8;
  _func_int **local_7c0;
  _func_int **local_7b8;
  _func_int **local_7a8;
  _func_int **local_788;
  _func_int **local_768;
  _func_int **local_760;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
  local_740;
  _func_int **local_738;
  _func_int **local_730;
  _func_int **local_728;
  __node_base_ptr local_720;
  _func_int **local_718;
  _func_int **local_710;
  _func_int **local_708;
  _func_int **local_700;
  String local_6f0;
  undefined1 local_6d0 [8];
  string _msg_1;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
  it_1;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>_>
  assigned_sam_range_1;
  ImmutableSamplerDesc *SamDesc_1;
  undefined1 local_678 [4];
  Uint32 i_4;
  undefined1 local_658 [8];
  string _msg;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
  it;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>_>
  assigned_sam_range;
  PipelineResourceDesc *Res_2;
  Uint32 i_3;
  String local_5f8;
  String local_5d8;
  _func_int **local_5b8;
  undefined1 local_5b0 [8];
  string msg_4;
  ImmutableSamplerDesc *Sam_1;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
  sam_it_2;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>_>
  imtbl_sam_range;
  Char *local_558;
  Char *local_550;
  _func_int **local_548;
  String local_540;
  String local_520;
  _func_int **local_500;
  _func_int **local_4f8;
  undefined1 local_4f0 [8];
  string msg_3;
  PipelineResourceDesc *Sam;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
  sam_it_1;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>_>
  sam_range_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined1 local_478 [8];
  String AssignedSamplerName;
  PipelineResourceDesc *Res_1;
  undefined1 local_448 [4];
  Uint32 i_2;
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  AssignedImtblSamplers;
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  AssignedSamplers;
  string msg_2;
  String local_3b0;
  String local_390;
  _func_int **local_370;
  undefined1 local_368 [8];
  string msg_1;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
  local_340;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
  sam_it;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>_>
  sam_range;
  _func_int **local_310;
  _func_int **local_308;
  ImmutableSamplerDesc *local_300;
  ImmutableSamplerDesc *SamDesc;
  undefined1 local_2f0 [4];
  Uint32 i_1;
  unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
  ImtblSamplers;
  _func_int **local_2b0;
  _func_int **local_2a8;
  String local_2a0;
  _func_int **local_280;
  _func_int **local_278;
  _func_int **local_270;
  _func_int **local_268;
  String local_260;
  Char *local_240;
  String local_238;
  _func_int **local_218;
  PIPELINE_RESOURCE_FLAGS local_209;
  undefined1 local_208 [7];
  PIPELINE_RESOURCE_FLAGS AllowedResourceFlags;
  String local_1e8;
  _func_int **local_1c8;
  undefined1 local_1c0 [8];
  string msg;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
  local_198;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
  res_it;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>_>
  res_range;
  _func_int **local_168;
  _func_int **local_160 [3];
  _func_int **local_148;
  _func_int **local_140;
  PipelineResourceDesc *Res;
  undefined1 local_130 [4];
  Uint32 i;
  unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
  Resources;
  uint local_ec;
  _func_int **local_e8;
  uint local_dc;
  _func_int **local_d8;
  uint local_cc;
  _func_int **local_c8;
  uint local_c0;
  uint local_bc;
  _func_int **local_b8;
  DeviceFeatures *local_b0;
  DeviceFeatures *Features;
  DeviceFeatures local_9c;
  float local_6c;
  float local_68;
  float local_64;
  Version VStack_60;
  Version VStack_58;
  Version VStack_50;
  Version VStack_48;
  RenderDeviceInfo *local_40;
  RenderDeviceInfo *DeviceInfo;
  IRenderDevice *pIStack_30;
  RENDER_DEVICE_TYPE DeviceType_local;
  IRenderDevice *pDevice_local;
  PipelineResourceSignatureDesc *Desc_local;
  
  DeviceInfo._4_4_ = DeviceType;
  pIStack_30 = pDevice;
  pDevice_local = (IRenderDevice *)Desc;
  if (pDevice == (IRenderDevice *)0x0) {
    Features._0_4_ = DeviceType;
    Version::Version((Version *)((long)&Features + 4));
    DeviceFeatures::DeviceFeatures(&local_9c,DEVICE_FEATURE_STATE_ENABLED);
    local_6c = 0.0;
    local_68 = 0.0;
    local_64 = 0.0;
    Version::Version(&VStack_60);
    Version::Version(&VStack_58);
    Version::Version(&VStack_50);
    Version::Version(&VStack_48);
  }
  else {
    iVar5 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
    memcpy(&Features,(void *)CONCAT44(extraout_var,iVar5),0x68);
  }
  local_40 = (RenderDeviceInfo *)&Features;
  local_b0 = &local_9c;
  if (7 < *(byte *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4)) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_700 = (_func_int **)0xe30c4c;
    }
    else {
      local_700 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_b8 = local_700;
    local_bc = (uint)*(byte *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4);
    local_c0 = 7;
    in_R8 = "Description of a pipeline resource signature \'";
    in_stack_fffffffffffff668 = "\' is invalid: ";
    LogError<true,char[47],char_const*,char[15],char[20],unsigned_int,char[38],unsigned_int,char[3]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x33,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&local_b8,(char (*) [15])"\' is invalid: ",
               (char (*) [20])"Desc.BindingIndex (",&local_bc,
               (char (*) [38])") exceeds the maximum allowed value (",&local_c0,
               (char (*) [3])0xf65ced);
  }
  if (0xffff < *(uint *)&pDevice_local[2].super_IObject._vptr_IObject) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_708 = (_func_int **)0xe30c4c;
    }
    else {
      local_708 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_c8 = local_708;
    local_cc = *(uint *)&pDevice_local[2].super_IObject._vptr_IObject;
    in_R8 = "Description of a pipeline resource signature \'";
    in_stack_fffffffffffff668 = "\' is invalid: ";
    LogError<true,char[47],char_const*,char[15],char[20],unsigned_int,char[38],unsigned_int,char[3]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x36,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&local_c8,(char (*) [15])"\' is invalid: ",
               (char (*) [20])"Desc.NumResources (",&local_cc,
               (char (*) [38])") exceeds the maximum allowed value (",&MAX_RESOURCES_IN_SIGNATURE,
               (char (*) [3])0xf65ced);
  }
  if ((*(int *)&pDevice_local[2].super_IObject._vptr_IObject != 0) &&
     (pDevice_local[1].super_IObject._vptr_IObject == (_func_int **)0x0)) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_710 = (_func_int **)0xe30c4c;
    }
    else {
      local_710 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_d8 = local_710;
    local_dc = *(uint *)&pDevice_local[2].super_IObject._vptr_IObject;
    in_R8 = "Description of a pipeline resource signature \'";
    in_stack_fffffffffffff668 = "\' is invalid: ";
    LogError<true,char[47],char_const*,char[15],char[20],unsigned_int,char[43]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x39,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&local_d8,(char (*) [15])"\' is invalid: ",
               (char (*) [20])"Desc.NumResources (",&local_dc,
               (char (*) [43])") is not zero, but Desc.Resources is null.");
  }
  if ((*(int *)&pDevice_local[4].super_IObject._vptr_IObject != 0) &&
     (pDevice_local[3].super_IObject._vptr_IObject == (_func_int **)0x0)) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_718 = (_func_int **)0xe30c4c;
    }
    else {
      local_718 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_e8 = local_718;
    local_ec = *(uint *)&pDevice_local[4].super_IObject._vptr_IObject;
    in_R8 = "Description of a pipeline resource signature \'";
    in_stack_fffffffffffff668 = "\' is invalid: ";
    LogError<true,char[47],char_const*,char[15],char[28],unsigned_int,char[51]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x3c,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&local_e8,(char (*) [15])"\' is invalid: ",
               (char (*) [28])"Desc.NumImmutableSamplers (",&local_ec,
               (char (*) [51])") is not zero, but Desc.ImmutableSamplers is null.");
  }
  if ((((ulong)pDevice_local[4].super_IObject._vptr_IObject & 0x10000000000) != 0) &&
     ((pDevice_local[5].super_IObject._vptr_IObject == (_func_int **)0x0 ||
      (*(char *)pDevice_local[5].super_IObject._vptr_IObject == '\0')))) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_720 = (__node_base_ptr)0xe30c4c;
    }
    else {
      local_720 = (__node_base_ptr)(pDevice_local->super_IObject)._vptr_IObject;
    }
    Resources._M_h._M_single_bucket = local_720;
    in_R8 = "Description of a pipeline resource signature \'";
    in_stack_fffffffffffff668 = "\' is invalid: ";
    LogError<true,char[47],char_const*,char[15],char[89]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x3f,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources._M_h._M_single_bucket,(char (*) [15])"\' is invalid: ",
               (char (*) [89])
               "Desc.UseCombinedTextureSamplers is true, but Desc.CombinedSamplerSuffix is null or empty"
              );
  }
  std::
  unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
  ::unordered_multimap
            ((unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
              *)local_130);
  for (Res._4_4_ = 0; Res._4_4_ < *(uint *)&pDevice_local[2].super_IObject._vptr_IObject;
      Res._4_4_ = Res._4_4_ + 1) {
    local_140 = pDevice_local[1].super_IObject._vptr_IObject + (ulong)Res._4_4_ * 3;
    if (*local_140 == (_func_int *)0x0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_728 = (_func_int **)0xe30c4c;
      }
      else {
        local_728 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_148 = local_728;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[25]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x49,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_148,(char (*) [15])"\' is invalid: ",(char (*) [16])0xf50cd6,
                 (uint *)((long)&Res + 4),(char (*) [25])"].Name must not be null.");
    }
    if (**local_140 == (_func_int)0x0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_730 = (_func_int **)0xe30c4c;
      }
      else {
        local_730 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_160[0] = local_730;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[26]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x4c,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)local_160,(char (*) [15])"\' is invalid: ",(char (*) [16])0xf50cd6,
                 (uint *)((long)&Res + 4),(char (*) [26])"].Name must not be empty.");
    }
    if (*(int *)(local_140 + 1) == 0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_738 = (_func_int **)0xe30c4c;
      }
      else {
        local_738 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_168 = local_738;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[48]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x4f,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_168,(char (*) [15])"\' is invalid: ",(char (*) [16])0xf50cd6,
                 (uint *)((long)&Res + 4),
                 (char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
    }
    if (*(int *)((long)local_140 + 0xc) == 0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_740._M_cur = (__node_type *)0xe30c4c;
      }
      else {
        local_740._M_cur = (__node_type *)(pDevice_local->super_IObject)._vptr_IObject;
      }
      res_range.second.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                 )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                   )local_740._M_cur;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[27]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x52,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&res_range.second,(char (*) [15])"\' is invalid: ",(char (*) [16])0xf50cd6
                 ,(uint *)((long)&Res + 4),(char (*) [27])"].ArraySize must not be 0.");
    }
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&res_it,(Char *)*local_140,false);
    pVar14 = std::
             unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
             ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
                            *)local_130,(key_type *)&res_it);
    res_range.first =
         pVar14.second.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
         ._M_cur;
    _Var12 = pVar14.first.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
    ;
    HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&res_it);
    local_198 = pVar14.first.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
    ;
    while( true ) {
      __y = &res_range;
      bVar3 = std::__detail::operator!=
                        (&local_198,
                         (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                          *)__y);
      PVar4 = (PIPELINE_RESOURCE_FLAGS)__y;
      if (!bVar3) break;
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
                             *)&local_198);
      SVar6 = operator&(ppVar7->second->ShaderStages,*(SHADER_TYPE *)(local_140 + 1));
      if (SVar6 != SHADER_TYPE_UNKNOWN) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_760 = (_func_int **)0xe30c4c;
        }
        else {
          local_760 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        msg.field_2._8_8_ = local_760;
        in_stack_fffffffffffff668 = "\' is invalid: ";
        in_R8 = "Description of a pipeline resource signature \'";
        _Var12._M_cur = (__node_type *)0x5b;
        LogError<true,char[47],char_const*,char[15],char[31],char_const*,char[149]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x5b,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)((long)&msg.field_2 + 8),(char (*) [15])"\' is invalid: ",
                   (char (*) [31])"Multiple resources with name \'",(char **)local_140,
                   (char (*) [149])
                   "\' specify overlapping shader stages. There may be multiple resources with the same name in different shader stages, but the stages must not overlap."
                  );
      }
      if (local_b0->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
        ppVar7 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
                               *)&local_198);
        SVar6 = extraout_EDX;
        if (ppVar7->second->ShaderStages == SHADER_TYPE_UNKNOWN) {
          FormatString<char[26],char[51]>
                    ((string *)local_1c0,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"res_it->second.ShaderStages != SHADER_TYPE_UNKNOWN",
                     (char (*) [51])_Var12._M_cur);
          pCVar8 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar8,"ValidatePipelineResourceSignatureDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                     ,0x60);
          std::__cxx11::string::~string((string *)local_1c0);
          SVar6 = extraout_EDX_00;
        }
        Args_4 = local_140;
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_768 = (_func_int **)0xe30c4c;
        }
        else {
          local_768 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        local_1c8 = local_768;
        GetShaderStagesString_abi_cxx11_
                  (&local_1e8,(Diligent *)(ulong)*(uint *)(local_140 + 1),SVar6);
        ppVar7 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
                               *)&local_198);
        GetShaderStagesString_abi_cxx11_
                  ((String *)local_208,(Diligent *)(ulong)ppVar7->second->ShaderStages,ShaderStages)
        ;
        in_stack_fffffffffffff668 = "\' is invalid: ";
        in_R8 = "Description of a pipeline resource signature \'";
        _Var12._M_cur = (__node_type *)0x66;
        LogError<true,char[47],char_const*,char[15],char[98],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[184]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x66,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&local_1c8,(char (*) [15])"\' is invalid: ",
                   (char (*) [98])
                   "This device does not support separable programs, but there are separate resources with the name \'"
                   ,(char **)Args_4,(char (*) [20])"\' in shader stages ",&local_1e8,
                   (char (*) [6])0xf44f16,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   (char (*) [184])0xf52a0d);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      std::__detail::
      _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
      ::operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
                    *)&local_198);
    }
    local_209 = GetValidPipelineResourceFlags(*(SHADER_RESOURCE_TYPE *)(local_140 + 2));
    a = *(PIPELINE_RESOURCE_FLAGS *)((long)local_140 + 0x12);
    PVar4 = operator~((Diligent *)(ulong)local_209,PVar4);
    PVar4 = operator&(a,PVar4);
    if (PVar4 != PIPELINE_RESOURCE_FLAG_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_788 = (_func_int **)0xe30c4c;
      }
      else {
        local_788 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_218 = local_788;
      GetPipelineResourceFlagsString_abi_cxx11_
                (&local_238,(Diligent *)(ulong)*(byte *)((long)local_140 + 0x12),
                 PIPELINE_RESOURCE_FLAG_NONE,true,in_R8);
      local_240 = GetShaderResourceTypeLiteralName(*(SHADER_RESOURCE_TYPE *)(local_140 + 2),false);
      GetPipelineResourceFlagsString_abi_cxx11_
                (&local_260,(Diligent *)(ulong)local_209,PIPELINE_RESOURCE_FLAG_NONE,true,in_R8);
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[10],std::__cxx11::string,char[45],char_const*,char[3],std::__cxx11::string,char[2]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x6f,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_218,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"Incorrect Desc.Resources[",(uint *)((long)&Res + 4),
                 (char (*) [10])"].Flags (",&local_238,
                 (char (*) [45])"). Only the following flags are valid for a ",&local_240,
                 (char (*) [3])0xec9916,&local_260,(char (*) [2])0xf544de);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_238);
    }
    PVar4 = operator&(*(PIPELINE_RESOURCE_FLAGS *)((long)local_140 + 0x12),
                      PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
    if ((PVar4 != PIPELINE_RESOURCE_FLAG_NONE) &&
       (local_b0->FormattedBuffers == DEVICE_FEATURE_STATE_DISABLED)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_7a8 = (_func_int **)0xe30c4c;
      }
      else {
        local_7a8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_268 = local_7a8;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[101]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x74,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_268,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"Incorrect Desc.Resources[",(uint *)((long)&Res + 4),
                 (char (*) [101])
                 "].Flags (FORMATTED_BUFFER). The flag can only be used if FormattedBuffers device feature is enabled."
                );
    }
    PVar4 = operator&(*(PIPELINE_RESOURCE_FLAGS *)((long)local_140 + 0x12),
                      PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY);
    SVar6 = extraout_EDX_01;
    if ((PVar4 != PIPELINE_RESOURCE_FLAG_NONE) &&
       (local_b0->ShaderResourceRuntimeArrays == DEVICE_FEATURE_STATE_DISABLED)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_7b8 = (_func_int **)0xe30c4c;
      }
      else {
        local_7b8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_270 = local_7b8;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[109]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x79,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_270,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"Incorrect Desc.Resources[",(uint *)((long)&Res + 4),
                 (char (*) [109])
                 "].Flags (RUNTIME_ARRAY). The flag can only be used if ShaderResourceRuntimeArrays device feature is enabled."
                );
      SVar6 = extraout_EDX_02;
    }
    if ((*(char *)(local_140 + 2) == '\b') &&
       (local_b0->RayTracing == DEVICE_FEATURE_STATE_DISABLED)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_7c0 = (_func_int **)0xe30c4c;
      }
      else {
        local_7c0 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_278 = local_7c0;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[71]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x7e,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_278,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"Incorrect Desc.Resources[",(uint *)((long)&Res + 4),
                 (char (*) [71])
                 "].ResourceType (ACCEL_STRUCT): ray tracing is not supported by device.");
      SVar6 = extraout_EDX_03;
    }
    if ((*(char *)(local_140 + 2) == '\a') && (*(int *)(local_140 + 1) != 2)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_7c8 = (_func_int **)0xe30c4c;
      }
      else {
        local_7c8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_280 = local_7c8;
      GetShaderStagesString_abi_cxx11_(&local_2a0,(Diligent *)(ulong)*(uint *)(local_140 + 1),SVar6)
      ;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[90],std::__cxx11::string,char[2]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x83,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_280,(char (*) [15])"\' is invalid: ",(char (*) [16])0xf50cd6,
                 (uint *)((long)&Res + 4),
                 (char (*) [90])
                 "].ResourceType (INPUT_ATTACHMENT) is only supported in pixel shader but ShaderStages are "
                 ,&local_2a0,(char (*) [2])0xf544de);
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    bVar3 = RenderDeviceInfo::IsD3DDevice(local_40);
    if ((((bVar3) || (bVar3 = RenderDeviceInfo::IsMetalDevice(local_40), bVar3)) &&
        (PVar4 = operator&(*(PIPELINE_RESOURCE_FLAGS *)((long)local_140 + 0x12),
                           PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER),
        PVar4 != PIPELINE_RESOURCE_FLAG_NONE)) &&
       (((ulong)pDevice_local[4].super_IObject._vptr_IObject & 0x10000000000) == 0)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_7d8 = (_func_int **)0xe30c4c;
      }
      else {
        local_7d8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_2a8 = local_7d8;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[197]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x8c,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_2a8,(char (*) [15])"\' is invalid: ",(char (*) [16])0xf50cd6,
                 (uint *)((long)&Res + 4),
                 (char (*) [197])
                 "].Flags contain COMBINED_SAMPLER flag, but Desc.UseCombinedTextureSamplers is false. In Direct3D and Metal backends, COMBINED_SAMPLER flag may only be used when UseCombinedTextureSamplers is true."
                );
    }
    PVar4 = operator&(*(PIPELINE_RESOURCE_FLAGS *)((long)local_140 + 0x12),
                      PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT);
    if (((PVar4 != PIPELINE_RESOURCE_FLAG_NONE) && (local_40->Type != RENDER_DEVICE_TYPE_UNDEFINED))
       && (bVar3 = RenderDeviceInfo::IsVulkanDevice(local_40), !bVar3)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_7e8 = (_func_int **)0xe30c4c;
      }
      else {
        local_7e8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_2b0 = local_7e8;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[71]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x94,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_2b0,(char (*) [15])"\' is invalid: ",(char (*) [16])0xf50cd6,
                 (uint *)((long)&Res + 4),
                 (char (*) [71])
                 "].Flags contain GENERAL_INPUT_ATTACHMENT which is only valid in Vulkan");
    }
    ImtblSamplers._M_h._M_single_bucket =
         (__node_base_ptr)
         std::
         unordered_multimap<Diligent::HashMapStringKey,Diligent::PipelineResourceDesc_const&,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::PipelineResourceDesc_const&>>>
         ::emplace<char_const*const&,Diligent::PipelineResourceDesc_const&>
                   ((unordered_multimap<Diligent::HashMapStringKey,Diligent::PipelineResourceDesc_const&,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::PipelineResourceDesc_const&>>>
                     *)local_130,(char **)local_140,(PipelineResourceDesc *)local_140);
  }
  std::
  unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
  ::unordered_multimap
            ((unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
              *)local_2f0);
  for (SamDesc._4_4_ = 0; SamDesc._4_4_ < *(uint *)&pDevice_local[4].super_IObject._vptr_IObject;
      SamDesc._4_4_ = SamDesc._4_4_ + 1) {
    local_300 = (ImmutableSamplerDesc *)
                (pDevice_local[3].super_IObject._vptr_IObject + (ulong)SamDesc._4_4_ * 9);
    if (local_300->SamplerOrTextureName == (Char *)0x0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_7f8 = (_func_int **)0xe30c4c;
      }
      else {
        local_7f8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_308 = local_7f8;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      LogError<true,char[47],char_const*,char[15],char[24],unsigned_int,char[41]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0xab,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_308,(char (*) [15])"\' is invalid: ",
                 (char (*) [24])"Desc.ImmutableSamplers[",(uint *)((long)&SamDesc + 4),
                 (char (*) [41])"].SamplerOrTextureName must not be null.");
    }
    if (*local_300->SamplerOrTextureName == '\0') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_800 = (_func_int **)0xe30c4c;
      }
      else {
        local_800 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_310 = local_800;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      LogError<true,char[47],char_const*,char[15],char[24],unsigned_int,char[42]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0xae,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&local_310,(char (*) [15])"\' is invalid: ",
                 (char (*) [24])"Desc.ImmutableSamplers[",(uint *)((long)&SamDesc + 4),
                 (char (*) [42])"].SamplerOrTextureName must not be empty.");
    }
    if (local_300->ShaderStages == SHADER_TYPE_UNKNOWN) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_808._M_cur = (__node_type *)0xe30c4c;
      }
      else {
        local_808._M_cur = (__node_type *)(pDevice_local->super_IObject)._vptr_IObject;
      }
      sam_range.second.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                 )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                   )local_808._M_cur;
      in_stack_fffffffffffff668 = "\' is invalid: ";
      LogError<true,char[47],char_const*,char[15],char[24],unsigned_int,char[48]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0xb1,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&sam_range.second,(char (*) [15])"\' is invalid: ",
                 (char (*) [24])"Desc.ImmutableSamplers[",(uint *)((long)&SamDesc + 4),
                 (char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
    }
    HashMapStringKey::HashMapStringKey
              ((HashMapStringKey *)&sam_it,local_300->SamplerOrTextureName,false);
    pVar15 = std::
             unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
             ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
                            *)local_2f0,(key_type *)&sam_it);
    sam_range.first =
         pVar15.second.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
         ._M_cur;
    _Var13 = pVar15.first.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
    ;
    HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&sam_it);
    local_340 = pVar15.first.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
    ;
    while (bVar3 = std::__detail::operator!=
                             (&local_340,
                              (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                               *)&sam_range), bVar3) {
      ppVar9 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
                             *)&local_340);
      SVar6 = operator&(ppVar9->second->ShaderStages,local_300->ShaderStages);
      if (SVar6 != SHADER_TYPE_UNKNOWN) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_828 = (_func_int **)0xe30c4c;
        }
        else {
          local_828 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        msg_1.field_2._8_8_ = local_828;
        in_stack_fffffffffffff668 = "\' is invalid: ";
        _Var13._M_cur = (__node_type *)0xba;
        LogError<true,char[47],char_const*,char[15],char[40],char_const*,char[158]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0xba,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)((long)&msg_1.field_2 + 8),(char (*) [15])"\' is invalid: ",
                   (char (*) [40])"Multiple immutable samplers with name \'",
                   &local_300->SamplerOrTextureName,
                   (char (*) [158])
                   "\' specify overlapping shader stages. There may be multiple immutable samplers with the same name in different shader stages, but the stages must not overlap."
                  );
      }
      if (local_b0->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
                               *)&local_340);
        SVar6 = extraout_EDX_04;
        if (ppVar9->second->ShaderStages == SHADER_TYPE_UNKNOWN) {
          FormatString<char[26],char[51]>
                    ((string *)local_368,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"sam_it->second.ShaderStages != SHADER_TYPE_UNKNOWN",
                     (char (*) [51])_Var13._M_cur);
          pCVar8 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar8,"ValidatePipelineResourceSignatureDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                     ,0xbe);
          std::__cxx11::string::~string((string *)local_368);
          SVar6 = extraout_EDX_05;
        }
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_830 = (_func_int **)0xe30c4c;
        }
        else {
          local_830 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        local_370 = local_830;
        Args_4_00 = &local_300->SamplerOrTextureName;
        GetShaderStagesString_abi_cxx11_
                  (&local_390,(Diligent *)(ulong)local_300->ShaderStages,SVar6);
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
                               *)&local_340);
        GetShaderStagesString_abi_cxx11_
                  (&local_3b0,(Diligent *)(ulong)ppVar9->second->ShaderStages,ShaderStages_00);
        in_stack_fffffffffffff668 = "\' is invalid: ";
        _Var13._M_cur = (__node_type *)0xc4;
        LogError<true,char[47],char_const*,char[15],char[107],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[192]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0xc4,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&local_370,(char (*) [15])"\' is invalid: ",
                   (char (*) [107])
                   "This device does not support separable programs, but there are separate immutable samplers with the name \'"
                   ,Args_4_00,(char (*) [20])"\' in shader stages ",&local_390,
                   (char (*) [6])0xf44f16,&local_3b0,
                   (char (*) [192])
                   ". When separable programs are not supported, every resource is always shared between all stages. Use distinct immutable sampler names for each stage or define a single sampler for all stages."
                  );
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_390);
      }
      std::__detail::
      _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
      ::operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
                    *)&local_340);
    }
    std::
    unordered_multimap<Diligent::HashMapStringKey,Diligent::ImmutableSamplerDesc_const&,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::ImmutableSamplerDesc_const&>>>
    ::emplace<char_const*const&,Diligent::ImmutableSamplerDesc_const&>
              ((unordered_multimap<Diligent::HashMapStringKey,Diligent::ImmutableSamplerDesc_const&,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::ImmutableSamplerDesc_const&>>>
                *)local_2f0,&local_300->SamplerOrTextureName,local_300);
  }
  if (((ulong)pDevice_local[4].super_IObject._vptr_IObject & 0x10000000000) != 0) {
    if (pDevice_local[5].super_IObject._vptr_IObject == (_func_int **)0x0) {
      FormatString<char[26],char[38]>
                ((string *)&AssignedSamplers._M_h._M_single_bucket,
                 (Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Desc.CombinedSamplerSuffix != nullptr",(char (*) [38])pDevice_local
                );
      pCVar8 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar8,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0xcd);
      std::__cxx11::string::~string((string *)&AssignedSamplers._M_h._M_single_bucket);
    }
    std::
    unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
    ::unordered_multimap
              ((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
                *)&AssignedImtblSamplers._M_h._M_single_bucket);
    std::
    unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
    ::unordered_multimap
              ((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
                *)local_448);
    for (Res_1._4_4_ = 0; Res_1._4_4_ < *(uint *)&pDevice_local[2].super_IObject._vptr_IObject;
        Res_1._4_4_ = Res_1._4_4_ + 1) {
      AssignedSamplerName.field_2._8_8_ =
           pDevice_local[1].super_IObject._vptr_IObject + (ulong)Res_1._4_4_ * 3;
      if (*(char *)(AssignedSamplerName.field_2._8_8_ + 0x10) == '\x02') {
        p_Var1 = *(_func_int **)AssignedSamplerName.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_498,(char *)p_Var1,
                   (allocator *)
                   ((long)&sam_range_1.second.
                           super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                           ._M_cur + 7));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_478,&local_498,(char *)pDevice_local[5].super_IObject._vptr_IObject);
        std::__cxx11::string::~string((string *)&local_498);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&sam_range_1.second.
                           super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                           ._M_cur + 7));
        pCVar8 = (Char *)std::__cxx11::string::c_str();
        HashMapStringKey::HashMapStringKey((HashMapStringKey *)&sam_it_1,pCVar8,false);
        pVar14 = std::
                 unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
                 ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
                                *)local_130,(key_type *)&sam_it_1);
        sam_range_1.first =
             pVar14.second.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
             ._M_cur;
        _Var12 = pVar14.first.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
        ;
        HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&sam_it_1);
        Sam = (PipelineResourceDesc *)
              pVar14.first.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
              ._M_cur.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
        ;
        while (bVar3 = std::__detail::operator!=
                                 ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                                   *)&Sam,(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                                           *)&sam_range_1), bVar3) {
          ppVar7 = std::__detail::
                   _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
                                 *)&Sam);
          msg_3.field_2._8_8_ = ppVar7->second;
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_478,((PipelineResourceDesc *)msg_3.field_2._8_8_)->Name);
          if (!bVar3) {
            FormatString<char[26],char[32]>
                      ((string *)local_4f0,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"AssignedSamplerName == Sam.Name",(char (*) [32])_Var12._M_cur
                      );
            pCVar8 = (Char *)std::__cxx11::string::c_str();
            _Var12._M_cur = (__node_type *)0xe3;
            DebugAssertionFailed
                      (pCVar8,"ValidatePipelineResourceSignatureDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                       ,0xe3);
            std::__cxx11::string::~string((string *)local_4f0);
          }
          SVar6 = operator&(*(SHADER_TYPE *)(msg_3.field_2._8_8_ + 8),
                            *(SHADER_TYPE *)(AssignedSamplerName.field_2._8_8_ + 8));
          if (SVar6 != SHADER_TYPE_UNKNOWN) {
            if (*(char *)(msg_3.field_2._8_8_ + 0x10) != '\x06') {
              if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
                local_878 = (_func_int **)0xe30c4c;
              }
              else {
                local_878 = (pDevice_local->super_IObject)._vptr_IObject;
              }
              local_4f8 = local_878;
              in_stack_fffffffffffff668 = "\' is invalid: ";
              LogError<true,char[47],char_const*,char[15],char[11],char_const*,char[26],char_const*,char[20]>
                        (false,"ValidatePipelineResourceSignatureDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                         ,0xe9,(char (*) [47])"Description of a pipeline resource signature \'",
                         (char **)&local_4f8,(char (*) [15])"\' is invalid: ",
                         (char (*) [11])"Resource \'",(char **)msg_3.field_2._8_8_,
                         (char (*) [26])"\' combined with texture \'",
                         (char **)AssignedSamplerName.field_2._8_8_,
                         (char (*) [20])"\' is not a sampler.");
            }
            SVar6 = operator&(*(SHADER_TYPE *)(msg_3.field_2._8_8_ + 8),
                              *(SHADER_TYPE *)(AssignedSamplerName.field_2._8_8_ + 8));
            uVar11 = AssignedSamplerName.field_2._8_8_;
            if (SVar6 != *(SHADER_TYPE *)(AssignedSamplerName.field_2._8_8_ + 8)) {
              if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
                local_888 = (_func_int **)0xe30c4c;
              }
              else {
                local_888 = (pDevice_local->super_IObject)._vptr_IObject;
              }
              local_500 = local_888;
              GetShaderStagesString_abi_cxx11_
                        (&local_520,
                         (Diligent *)(ulong)*(uint *)(AssignedSamplerName.field_2._8_8_ + 8),
                         ShaderStages_01);
              Args_8 = msg_3.field_2._8_8_;
              GetShaderStagesString_abi_cxx11_
                        (&local_540,(Diligent *)(ulong)*(uint *)(msg_3.field_2._8_8_ + 8),
                         ShaderStages_02);
              in_stack_fffffffffffff668 = "\' is invalid: ";
              LogError<true,char[47],char_const*,char[15],char[10],char_const*,char[47],std::__cxx11::string,char[16],char_const*,char[50],std::__cxx11::string,char[231]>
                        (false,"ValidatePipelineResourceSignatureDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                         ,0xf1,(char (*) [47])"Description of a pipeline resource signature \'",
                         (char **)&local_500,(char (*) [15])"\' is invalid: ",
                         (char (*) [10])0xf4cd7e,(char **)uVar11,
                         (char (*) [47])"\' is defined for the following shader stages: ",&local_520
                         ,(char (*) [16])", but sampler \'",(char **)Args_8,
                         (char (*) [50])"\' assigned to it uses only some of these stages: ",
                         &local_540,
                         (char (*) [231])
                         ". A resource that is present in multiple shader stages can\'t be combined with different samplers in different stages. Either use separate resources for different stages, or define the sampler for all stages that the resource uses."
                        );
              std::__cxx11::string::~string((string *)&local_540);
              std::__cxx11::string::~string((string *)&local_520);
            }
            if (*(char *)(msg_3.field_2._8_8_ + 0x11) !=
                *(char *)(AssignedSamplerName.field_2._8_8_ + 0x11)) {
              if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
                local_8a8 = (_func_int **)0xe30c4c;
              }
              else {
                local_8a8 = (pDevice_local->super_IObject)._vptr_IObject;
              }
              local_548 = local_8a8;
              local_550 = GetShaderVariableTypeLiteralName
                                    (*(SHADER_RESOURCE_VARIABLE_TYPE *)
                                      (AssignedSamplerName.field_2._8_8_ + 0x11),false);
              uVar11 = AssignedSamplerName.field_2._8_8_;
              local_558 = GetShaderVariableTypeLiteralName
                                    (*(SHADER_RESOURCE_VARIABLE_TYPE *)(msg_3.field_2._8_8_ + 0x11),
                                     false);
              in_stack_fffffffffffff668 = "\' is invalid: ";
              LogError<true,char[47],char_const*,char[15],char[11],char_const*,char[24],char_const*,char[28],char_const*,char[15],char_const*,char[26]>
                        (false,"ValidatePipelineResourceSignatureDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                         ,0xf8,(char (*) [47])"Description of a pipeline resource signature \'",
                         (char **)&local_548,(char (*) [15])"\' is invalid: ",
                         (char (*) [11])"The type (",&local_550,
                         (char (*) [24])") of texture resource \'",(char **)uVar11,
                         (char (*) [28])"\' does not match the type (",&local_558,
                         (char (*) [15])") of sampler \'",(char **)msg_3.field_2._8_8_,
                         (char (*) [26])"\' that is assigned to it.");
            }
            imtbl_sam_range.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
            ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                       )std::
                        unordered_multimap<Diligent::HashMapStringKey,Diligent::SHADER_TYPE,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>>
                        ::emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
                                  ((unordered_multimap<Diligent::HashMapStringKey,Diligent::SHADER_TYPE,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>>
                                    *)&AssignedImtblSamplers._M_h._M_single_bucket,
                                   (char **)msg_3.field_2._8_8_,
                                   (SHADER_TYPE *)(msg_3.field_2._8_8_ + 8));
            break;
          }
          std::__detail::
          _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
          ::operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
                        *)&Sam);
        }
        std::__cxx11::string::~string((string *)local_478);
        HashMapStringKey::HashMapStringKey
                  ((HashMapStringKey *)&sam_it_2,*(Char **)AssignedSamplerName.field_2._8_8_,false);
        pVar15 = std::
                 unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
                 ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
                                *)local_2f0,(key_type *)&sam_it_2);
        imtbl_sam_range.first =
             pVar15.second.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
             ._M_cur;
        _Var13 = pVar15.first.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
        ;
        HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&sam_it_2);
        Sam_1 = (ImmutableSamplerDesc *)
                pVar15.first.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
        ;
        while (bVar3 = std::__detail::operator!=
                                 ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                                   *)&Sam_1,
                                  (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                                   *)&imtbl_sam_range), bVar3) {
          ppVar9 = std::__detail::
                   _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
                                 *)&Sam_1);
          msg_4.field_2._8_8_ = ppVar9->second;
          iVar5 = strcmp(((ImmutableSamplerDesc *)msg_4.field_2._8_8_)->SamplerOrTextureName,
                         *(char **)AssignedSamplerName.field_2._8_8_);
          if (iVar5 != 0) {
            FormatString<char[26],char[48]>
                      ((string *)local_5b0,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"strcmp(Sam.SamplerOrTextureName, Res.Name) == 0",
                       (char (*) [48])_Var13._M_cur);
            pCVar8 = (Char *)std::__cxx11::string::c_str();
            _Var13._M_cur = (__node_type *)0x107;
            DebugAssertionFailed
                      (pCVar8,"ValidatePipelineResourceSignatureDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                       ,0x107);
            std::__cxx11::string::~string((string *)local_5b0);
          }
          SVar6 = operator&(*(SHADER_TYPE *)msg_4.field_2._8_8_,
                            *(SHADER_TYPE *)(AssignedSamplerName.field_2._8_8_ + 8));
          if (SVar6 != SHADER_TYPE_UNKNOWN) {
            SVar6 = operator&(*(SHADER_TYPE *)msg_4.field_2._8_8_,
                              *(SHADER_TYPE *)(AssignedSamplerName.field_2._8_8_ + 8));
            uVar11 = AssignedSamplerName.field_2._8_8_;
            if (SVar6 != *(SHADER_TYPE *)(AssignedSamplerName.field_2._8_8_ + 8)) {
              if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
                local_8f0 = (_func_int **)0xe30c4c;
              }
              else {
                local_8f0 = (pDevice_local->super_IObject)._vptr_IObject;
              }
              local_5b8 = local_8f0;
              GetShaderStagesString_abi_cxx11_
                        (&local_5d8,
                         (Diligent *)(ulong)*(uint *)(AssignedSamplerName.field_2._8_8_ + 8),
                         ShaderStages_03);
              GetShaderStagesString_abi_cxx11_
                        (&local_5f8,(Diligent *)(ulong)*(uint *)msg_4.field_2._8_8_,ShaderStages_04)
              ;
              in_stack_fffffffffffff668 = "\' is invalid: ";
              LogError<true,char[47],char_const*,char[15],char[10],char_const*,char[47],std::__cxx11::string,char[80],std::__cxx11::string,char[250]>
                        (false,"ValidatePipelineResourceSignatureDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                         ,0x110,(char (*) [47])"Description of a pipeline resource signature \'",
                         (char **)&local_5b8,(char (*) [15])"\' is invalid: ",
                         (char (*) [10])0xf4cd7e,(char **)uVar11,
                         (char (*) [47])"\' is defined for the following shader stages: ",&local_5d8
                         ,(char (*) [80])
                          ", but immutable sampler that is assigned to it uses only some of these stages: "
                         ,&local_5f8,
                         (char (*) [250])
                         ". A resource that is present in multiple shader stages can\'t be combined with different immutable samples in different stages. Either use separate resources for different stages, or define the immutable sampler for all stages that the resource uses."
                        );
              std::__cxx11::string::~string((string *)&local_5f8);
              std::__cxx11::string::~string((string *)&local_5d8);
            }
            std::
            unordered_multimap<Diligent::HashMapStringKey,Diligent::SHADER_TYPE,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>>
            ::emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
                      ((unordered_multimap<Diligent::HashMapStringKey,Diligent::SHADER_TYPE,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>>
                        *)local_448,(char **)(msg_4.field_2._8_8_ + 8),
                       (SHADER_TYPE *)msg_4.field_2._8_8_);
            break;
          }
          std::__detail::
          _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
          ::operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>
                        *)&Sam_1);
        }
      }
    }
    for (Res_2._4_4_ = 0; Res_2._4_4_ < *(uint *)&pDevice_local[2].super_IObject._vptr_IObject;
        Res_2._4_4_ = Res_2._4_4_ + 1) {
      assigned_sam_range.second.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                 )(pDevice_local[1].super_IObject._vptr_IObject + (ulong)Res_2._4_4_ * 3);
      if ((((__node_type *)
           assigned_sam_range.second.
           super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
           ._M_cur)->
          super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
          ).
          super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
          ._M_storage._M_storage.__data[8] == '\x06') {
        HashMapStringKey::HashMapStringKey
                  ((HashMapStringKey *)&it,
                   (Char *)(((__node_type *)
                            assigned_sam_range.second.
                            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                            ._M_cur)->super__Hash_node_base)._M_nxt,false);
        pVar16 = std::
                 unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
                 ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
                                *)&AssignedImtblSamplers._M_h._M_single_bucket,(key_type *)&it);
        assigned_sam_range.first =
             pVar16.second.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
             ._M_cur;
        HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&it);
        _msg.field_2._8_8_ =
             pVar16.first.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
        ;
        while ((bVar3 = std::__detail::operator!=
                                  ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                    *)((long)&_msg.field_2 + 8),
                                   (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                    *)&assigned_sam_range), bVar3 &&
               (ppVar10 = std::__detail::
                          _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                          ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                                        *)((long)&_msg.field_2 + 8)),
               ppVar10->second !=
               *(SHADER_TYPE *)
                ((long)assigned_sam_range.second.
                       super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                       ._M_cur + 8)))) {
          std::__detail::
          _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
          ::operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                        *)((long)&_msg.field_2 + 8));
        }
        bVar3 = std::__detail::operator==
                          ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                            *)((long)&_msg.field_2 + 8),
                           (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                            *)&assigned_sam_range);
        Args = assigned_sam_range.second;
        if (bVar3) {
          GetShaderStagesString_abi_cxx11_
                    ((String *)local_678,
                     (Diligent *)
                     (ulong)*(uint *)((long)assigned_sam_range.second.
                                            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                            ._M_cur + 8),ShaderStages_05);
          FormatString<char[10],char_const*,char[4],std::__cxx11::string,char[120]>
                    ((string *)local_658,(Diligent *)"Sampler \'",
                     (char (*) [10])
                     Args.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                     ._M_cur,(char **)"\' (",(char (*) [4])local_678,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ")\' is not assigned to any texture. All samplers should be assigned to textures when combined texture samplers are used."
                     ,(char (*) [120])in_stack_fffffffffffff668);
          std::__cxx11::string::~string((string *)local_678);
          puVar2 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar11 = std::__cxx11::string::c_str();
            (*(code *)puVar2)(1,uVar11,0);
          }
          std::__cxx11::string::~string((string *)local_658);
        }
      }
    }
    for (SamDesc_1._4_4_ = 0;
        SamDesc_1._4_4_ < *(uint *)&pDevice_local[4].super_IObject._vptr_IObject;
        SamDesc_1._4_4_ = SamDesc_1._4_4_ + 1) {
      assigned_sam_range_1.second.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                 )(pDevice_local[3].super_IObject._vptr_IObject + (ulong)SamDesc_1._4_4_ * 9);
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)&it_1,
                 (Char *)(((__node_type *)
                          assigned_sam_range_1.second.
                          super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                          ._M_cur)->
                         super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                         ._M_storage._M_storage.__align,false);
      pVar16 = std::
               unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
               ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
                              *)local_448,(key_type *)&it_1);
      assigned_sam_range_1.first =
           pVar16.second.
           super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
           ._M_cur;
      HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&it_1);
      _msg_1.field_2._8_8_ =
           pVar16.first.
           super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
           ._M_cur.
           super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
      ;
      while ((bVar3 = std::__detail::operator!=
                                ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                  *)((long)&_msg_1.field_2 + 8),
                                 (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                  *)&assigned_sam_range_1), bVar3 &&
             (ppVar10 = std::__detail::
                        _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                        ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                                      *)((long)&_msg_1.field_2 + 8)),
             ppVar10->second !=
             *(SHADER_TYPE *)
              assigned_sam_range_1.second.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
              ._M_cur))) {
        std::__detail::
        _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
        ::operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                      *)((long)&_msg_1.field_2 + 8));
      }
      bVar3 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                          *)((long)&_msg_1.field_2 + 8),
                         (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                          *)&assigned_sam_range_1);
      if (bVar3) {
        Args_00 = (char (*) [20])
                  ((long)assigned_sam_range_1.second.
                         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                         ._M_cur + 8);
        GetShaderStagesString_abi_cxx11_
                  (&local_6f0,
                   (Diligent *)
                   (ulong)*(uint *)assigned_sam_range_1.second.
                                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                   ._M_cur,ShaderStages_06);
        FormatString<char[20],char_const*,char[4],std::__cxx11::string,char[152]>
                  ((string *)local_6d0,(Diligent *)"Immutable sampler \'",Args_00,(char **)"\' (",
                   (char (*) [4])&local_6f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ") is not assigned to any texture or sampler. All immutable samplers should be assigned to textures or samplers when combined texture samplers are used."
                   ,(char (*) [152])in_stack_fffffffffffff668);
        std::__cxx11::string::~string((string *)&local_6f0);
        puVar2 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar11 = std::__cxx11::string::c_str();
          (*(code *)puVar2)(1,uVar11,0);
        }
        std::__cxx11::string::~string((string *)local_6d0);
      }
    }
    std::
    unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
    ::~unordered_multimap
              ((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
                *)local_448);
    std::
    unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
    ::~unordered_multimap
              ((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
                *)&AssignedImtblSamplers._M_h._M_single_bucket);
  }
  std::
  unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
  ::~unordered_multimap
            ((unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
              *)local_2f0);
  std::
  unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
  ::~unordered_multimap
            ((unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
              *)local_130);
  return;
}

Assistant:

void ValidatePipelineResourceSignatureDesc(const PipelineResourceSignatureDesc& Desc,
                                           const IRenderDevice*                 pDevice,
                                           RENDER_DEVICE_TYPE                   DeviceType) noexcept(false)
{
    const RenderDeviceInfo& DeviceInfo = pDevice != nullptr ?
        pDevice->GetDeviceInfo() :
        RenderDeviceInfo{DeviceType, Version{}, DeviceFeatures{DEVICE_FEATURE_STATE_ENABLED}};

    const DeviceFeatures& Features = DeviceInfo.Features;

    if (Desc.BindingIndex >= MAX_RESOURCE_SIGNATURES)
        LOG_PRS_ERROR_AND_THROW("Desc.BindingIndex (", Uint32{Desc.BindingIndex}, ") exceeds the maximum allowed value (", MAX_RESOURCE_SIGNATURES - 1, ").");

    if (Desc.NumResources > MAX_RESOURCES_IN_SIGNATURE)
        LOG_PRS_ERROR_AND_THROW("Desc.NumResources (", Uint32{Desc.NumResources}, ") exceeds the maximum allowed value (", MAX_RESOURCES_IN_SIGNATURE, ").");

    if (Desc.NumResources != 0 && Desc.Resources == nullptr)
        LOG_PRS_ERROR_AND_THROW("Desc.NumResources (", Uint32{Desc.NumResources}, ") is not zero, but Desc.Resources is null.");

    if (Desc.NumImmutableSamplers != 0 && Desc.ImmutableSamplers == nullptr)
        LOG_PRS_ERROR_AND_THROW("Desc.NumImmutableSamplers (", Uint32{Desc.NumImmutableSamplers}, ") is not zero, but Desc.ImmutableSamplers is null.");

    if (Desc.UseCombinedTextureSamplers && (Desc.CombinedSamplerSuffix == nullptr || Desc.CombinedSamplerSuffix[0] == '\0'))
        LOG_PRS_ERROR_AND_THROW("Desc.UseCombinedTextureSamplers is true, but Desc.CombinedSamplerSuffix is null or empty");


    // Hash map of all resources by name
    std::unordered_multimap<HashMapStringKey, const PipelineResourceDesc&> Resources;
    for (Uint32 i = 0; i < Desc.NumResources; ++i)
    {
        const PipelineResourceDesc& Res = Desc.Resources[i];

        if (Res.Name == nullptr)
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].Name must not be null.");

        if (Res.Name[0] == '\0')
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].Name must not be empty.");

        if (Res.ShaderStages == SHADER_TYPE_UNKNOWN)
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

        if (Res.ArraySize == 0)
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].ArraySize must not be 0.");

        const auto res_range = Resources.equal_range(Res.Name);
        for (auto res_it = res_range.first; res_it != res_range.second; ++res_it)
        {
            if ((res_it->second.ShaderStages & Res.ShaderStages) != 0)
            {
                LOG_PRS_ERROR_AND_THROW("Multiple resources with name '", Res.Name,
                                        "' specify overlapping shader stages. There may be multiple resources with the same name in different shader stages, "
                                        "but the stages must not overlap.");
            }

            if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
            {
                VERIFY_EXPR(res_it->second.ShaderStages != SHADER_TYPE_UNKNOWN);
                LOG_PRS_ERROR_AND_THROW("This device does not support separable programs, but there are separate resources with the name '",
                                        Res.Name, "' in shader stages ",
                                        GetShaderStagesString(Res.ShaderStages), " and ",
                                        GetShaderStagesString(res_it->second.ShaderStages),
                                        ". When separable programs are not supported, every resource is always shared between all stages. "
                                        "Use distinct resource names for each stage or define a single resource for all stages.");
            }
        }

        PIPELINE_RESOURCE_FLAGS AllowedResourceFlags = GetValidPipelineResourceFlags(Res.ResourceType);
        if ((Res.Flags & ~AllowedResourceFlags) != 0)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].Flags (", GetPipelineResourceFlagsString(Res.Flags),
                                    "). Only the following flags are valid for a ", GetShaderResourceTypeLiteralName(Res.ResourceType),
                                    ": ", GetPipelineResourceFlagsString(AllowedResourceFlags, false, ", "), ".");
        }

        if ((Res.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0 && Features.FormattedBuffers == DEVICE_FEATURE_STATE_DISABLED)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].Flags (FORMATTED_BUFFER). The flag can only be used if FormattedBuffers device feature is enabled.");
        }

        if ((Res.Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) != 0 && Features.ShaderResourceRuntimeArrays == DEVICE_FEATURE_STATE_DISABLED)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].Flags (RUNTIME_ARRAY). The flag can only be used if ShaderResourceRuntimeArrays device feature is enabled.");
        }

        if (Res.ResourceType == SHADER_RESOURCE_TYPE_ACCEL_STRUCT && Features.RayTracing == DEVICE_FEATURE_STATE_DISABLED)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].ResourceType (ACCEL_STRUCT): ray tracing is not supported by device.");
        }

        if (Res.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT && Res.ShaderStages != SHADER_TYPE_PIXEL)
        {
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].ResourceType (INPUT_ATTACHMENT) is only supported in pixel shader but ShaderStages are ", GetShaderStagesString(Res.ShaderStages), ".");
        }

        if (DeviceInfo.IsD3DDevice() || DeviceInfo.IsMetalDevice())
        {
            if ((Res.Flags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) != 0 && !Desc.UseCombinedTextureSamplers)
            {
                LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i,
                                        "].Flags contain COMBINED_SAMPLER flag, but Desc.UseCombinedTextureSamplers is false. "
                                        "In Direct3D and Metal backends, COMBINED_SAMPLER flag may only be used when UseCombinedTextureSamplers is true.");
            }
        }

        if ((Res.Flags & PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT) != 0 &&
            DeviceInfo.Type != RENDER_DEVICE_TYPE_UNDEFINED && // May be UNDEFINED for serialized signature
            !DeviceInfo.IsVulkanDevice())
        {
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].Flags contain GENERAL_INPUT_ATTACHMENT which is only valid in Vulkan");
        }

        Resources.emplace(Res.Name, Res);

        // NB: when creating immutable sampler array, we have to define the sampler as both resource and
        //     immutable sampler. The sampler will not be exposed as a shader variable though.
        //if (Res.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
        //{
        //    if (FindImmutableSampler(Desc.ImmutableSamplers, Desc.NumImmutableSamplers, Res.ShaderStages, Res.Name,
        //                             Desc.UseCombinedTextureSamplers ? Desc.CombinedSamplerSuffix : nullptr) >= 0)
        //    {
        //        LOG_PRS_ERROR_AND_THROW("Sampler '", Res.Name, "' is defined as both shader resource and immutable sampler.");
        //    }
        //}
    }

    // Hash map of all immutable samplers by name
    std::unordered_multimap<HashMapStringKey, const ImmutableSamplerDesc&> ImtblSamplers;
    for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
    {
        const ImmutableSamplerDesc& SamDesc = Desc.ImmutableSamplers[i];
        if (SamDesc.SamplerOrTextureName == nullptr)
            LOG_PRS_ERROR_AND_THROW("Desc.ImmutableSamplers[", i, "].SamplerOrTextureName must not be null.");

        if (SamDesc.SamplerOrTextureName[0] == '\0')
            LOG_PRS_ERROR_AND_THROW("Desc.ImmutableSamplers[", i, "].SamplerOrTextureName must not be empty.");

        if (SamDesc.ShaderStages == SHADER_TYPE_UNKNOWN)
            LOG_PRS_ERROR_AND_THROW("Desc.ImmutableSamplers[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

        const auto sam_range = ImtblSamplers.equal_range(SamDesc.SamplerOrTextureName);
        for (auto sam_it = sam_range.first; sam_it != sam_range.second; ++sam_it)
        {
            if ((sam_it->second.ShaderStages & SamDesc.ShaderStages) != 0)
            {
                LOG_PRS_ERROR_AND_THROW("Multiple immutable samplers with name '", SamDesc.SamplerOrTextureName,
                                        "' specify overlapping shader stages. There may be multiple immutable samplers with the same name in different shader stages, "
                                        "but the stages must not overlap.");
            }
            if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
            {
                VERIFY_EXPR(sam_it->second.ShaderStages != SHADER_TYPE_UNKNOWN);
                LOG_PRS_ERROR_AND_THROW("This device does not support separable programs, but there are separate immutable samplers with the name '",
                                        SamDesc.SamplerOrTextureName, "' in shader stages ",
                                        GetShaderStagesString(SamDesc.ShaderStages), " and ",
                                        GetShaderStagesString(sam_it->second.ShaderStages),
                                        ". When separable programs are not supported, every resource is always shared between all stages. "
                                        "Use distinct immutable sampler names for each stage or define a single sampler for all stages.");
            }
        }

        ImtblSamplers.emplace(SamDesc.SamplerOrTextureName, SamDesc);
    }

    if (Desc.UseCombinedTextureSamplers)
    {
        VERIFY_EXPR(Desc.CombinedSamplerSuffix != nullptr);

        // List of samplers assigned to some texture
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> AssignedSamplers;
        // List of immutable samplers assigned to some texture
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> AssignedImtblSamplers;
        for (Uint32 i = 0; i < Desc.NumResources; ++i)
        {
            const PipelineResourceDesc& Res = Desc.Resources[i];
            if (Res.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV)
            {
                // Only texture SRVs can be combined with samplers
                continue;
            }

            {
                const String AssignedSamplerName = String{Res.Name} + Desc.CombinedSamplerSuffix;

                const auto sam_range = Resources.equal_range(AssignedSamplerName.c_str());
                for (auto sam_it = sam_range.first; sam_it != sam_range.second; ++sam_it)
                {
                    const PipelineResourceDesc& Sam = sam_it->second;
                    VERIFY_EXPR(AssignedSamplerName == Sam.Name);

                    if ((Sam.ShaderStages & Res.ShaderStages) != 0)
                    {
                        if (Sam.ResourceType != SHADER_RESOURCE_TYPE_SAMPLER)
                        {
                            LOG_PRS_ERROR_AND_THROW("Resource '", Sam.Name, "' combined with texture '", Res.Name, "' is not a sampler.");
                        }

                        if ((Sam.ShaderStages & Res.ShaderStages) != Res.ShaderStages)
                        {
                            LOG_PRS_ERROR_AND_THROW("Texture '", Res.Name, "' is defined for the following shader stages: ", GetShaderStagesString(Res.ShaderStages),
                                                    ", but sampler '", Sam.Name, "' assigned to it uses only some of these stages: ", GetShaderStagesString(Sam.ShaderStages),
                                                    ". A resource that is present in multiple shader stages can't be combined with different samplers in different stages. "
                                                    "Either use separate resources for different stages, or define the sampler for all stages that the resource uses.");
                        }

                        if (Sam.VarType != Res.VarType)
                        {
                            LOG_PRS_ERROR_AND_THROW("The type (", GetShaderVariableTypeLiteralName(Res.VarType), ") of texture resource '", Res.Name,
                                                    "' does not match the type (", GetShaderVariableTypeLiteralName(Sam.VarType),
                                                    ") of sampler '", Sam.Name, "' that is assigned to it.");
                        }

                        AssignedSamplers.emplace(Sam.Name, Sam.ShaderStages);

                        break;
                    }
                }
            }

            {
                const auto imtbl_sam_range = ImtblSamplers.equal_range(Res.Name);
                for (auto sam_it = imtbl_sam_range.first; sam_it != imtbl_sam_range.second; ++sam_it)
                {
                    const ImmutableSamplerDesc& Sam = sam_it->second;
                    VERIFY_EXPR(strcmp(Sam.SamplerOrTextureName, Res.Name) == 0);

                    if ((Sam.ShaderStages & Res.ShaderStages) != 0)
                    {
                        if ((Sam.ShaderStages & Res.ShaderStages) != Res.ShaderStages)
                        {
                            LOG_PRS_ERROR_AND_THROW("Texture '", Res.Name, "' is defined for the following shader stages: ", GetShaderStagesString(Res.ShaderStages),
                                                    ", but immutable sampler that is assigned to it uses only some of these stages: ", GetShaderStagesString(Sam.ShaderStages),
                                                    ". A resource that is present in multiple shader stages can't be combined with different immutable samples in different stages. "
                                                    "Either use separate resources for different stages, or define the immutable sampler for all stages that the resource uses.");
                        }

                        AssignedImtblSamplers.emplace(Sam.SamplerOrTextureName, Sam.ShaderStages);

                        break;
                    }
                }
            }
        }

        for (Uint32 i = 0; i < Desc.NumResources; ++i)
        {
            const PipelineResourceDesc& Res = Desc.Resources[i];
            if (Res.ResourceType != SHADER_RESOURCE_TYPE_SAMPLER)
                continue;

            auto assigned_sam_range = AssignedSamplers.equal_range(Res.Name);

            auto it = assigned_sam_range.first;
            while (it != assigned_sam_range.second)
            {
                if (it->second == Res.ShaderStages)
                    break;
                ++it;
            }
            if (it == assigned_sam_range.second)
            {
                LOG_WARNING_MESSAGE("Sampler '", Res.Name, "' (", GetShaderStagesString(Res.ShaderStages), ")' is not assigned to any texture. All samplers should be assigned to textures when combined texture samplers are used.");
            }
        }

        for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
        {
            const ImmutableSamplerDesc& SamDesc = Desc.ImmutableSamplers[i];

            auto assigned_sam_range = AssignedImtblSamplers.equal_range(SamDesc.SamplerOrTextureName);

            auto it = assigned_sam_range.first;
            while (it != assigned_sam_range.second)
            {
                if (it->second == SamDesc.ShaderStages)
                    break;
                ++it;
            }
            if (it == assigned_sam_range.second)
            {
                LOG_WARNING_MESSAGE("Immutable sampler '", SamDesc.SamplerOrTextureName, "' (", GetShaderStagesString(SamDesc.ShaderStages), ") is not assigned to any texture or sampler. All immutable samplers should be assigned to textures or samplers when combined texture samplers are used.");
            }
        }
    }
}